

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.hpp
# Opt level: O0

void __thiscall cinatra::http_parser::http_parser(http_parser *this)

{
  undefined4 *in_RDI;
  array<cinatra::http_header,_100UL> *unaff_retaddr;
  
  *in_RDI = 0;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)(in_RDI + 2));
  *(undefined8 *)(in_RDI + 6) = 0;
  in_RDI[8] = 0;
  *(undefined8 *)(in_RDI + 10) = 0;
  *(undefined1 *)(in_RDI + 0xc) = 0;
  *(undefined1 *)((long)in_RDI + 0x31) = 0;
  *(undefined1 *)((long)in_RDI + 0x32) = 0;
  std::array<cinatra::http_header,_100UL>::array(unaff_retaddr);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)(in_RDI + 0x32e));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)(in_RDI + 0x332));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)(in_RDI + 0x336));
  std::
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  ::unordered_map((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                   *)0x267a27);
  return;
}

Assistant:

void parse_body_len() {
    auto header_value = this->get_header_value("content-length"sv);
    if (header_value.empty()) {
      body_len_ = 0;
    }
    else {
      auto [ptr, ec] = std::from_chars(
          header_value.data(), header_value.data() + header_value.size(),
          body_len_, 10);
      if (ec != std::errc{}) {
        body_len_ = -1;
      }
    }
  }